

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O1

void P_LoadLineDefs2(MapData *map)

{
  double *pdVar1;
  byte *pbVar2;
  double dVar3;
  ushort uVar4;
  ushort uVar5;
  FileReader *pFVar6;
  undefined1 auVar7 [16];
  DWORD DVar8;
  int iVar9;
  uint uVar10;
  ushort *puVar11;
  int iVar12;
  ulong uVar13;
  ushort *puVar14;
  line_t *ld;
  long lVar15;
  
  pFVar6 = map->MapLumps[2].Reader;
  if (pFVar6 == (FileReader *)0x0) {
    iVar12 = 0;
  }
  else {
    iVar12 = (int)pFVar6->Length;
  }
  uVar10 = iVar12 >> 4;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (long)(int)uVar10;
  uVar13 = 0xffffffffffffffff;
  if (SUB168(auVar7 * ZEXT816(0x98),8) == 0) {
    uVar13 = SUB168(auVar7 * ZEXT816(0x98),0);
  }
  numlines = uVar10;
  lines = (line_t *)operator_new__(uVar13);
  TArray<int,_int>::Resize(&linemap,uVar10);
  memset(lines,0,(long)numlines * 0x98);
  puVar11 = (ushort *)operator_new__((long)iVar12);
  pFVar6 = map->MapLumps[2].Reader;
  lVar15 = pFVar6->Length;
  map->file = pFVar6;
  (*(pFVar6->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar6,0,0);
  (*(map->file->super_FileReaderBase)._vptr_FileReaderBase[2])(map->file,puVar11,(long)(int)lVar15);
  sidecount = 0;
  if (0 < numlines) {
    uVar13 = 0;
    iVar12 = 0;
    do {
      uVar10 = (uint)uVar13;
      lVar15 = (long)(int)uVar10;
      puVar14 = puVar11 + lVar15 * 8;
      uVar4 = puVar11[lVar15 * 8];
      uVar5 = puVar11[lVar15 * 8 + 1];
      if (uVar4 == uVar5) {
LAB_005399a4:
        Printf("Removing 0-length line %d\n",(ulong)(uVar10 + iVar12));
        iVar9 = numlines;
        memmove(puVar14,puVar14 + 8,(long)(int)(~uVar10 + numlines) << 4);
        iVar12 = iVar12 + 1;
        numlines = iVar9 + -1;
      }
      else {
        dVar3 = vertexes[uVar4].p.X;
        if ((dVar3 == vertexes[uVar5].p.X) && (!NAN(dVar3) && !NAN(vertexes[uVar5].p.X))) {
          dVar3 = vertexes[uVar4].p.Y;
          pdVar1 = &vertexes[uVar5].p.Y;
          if ((dVar3 == *pdVar1) && (!NAN(dVar3) && !NAN(*pdVar1))) goto LAB_005399a4;
        }
        if (puVar14[6] == 0xffff) {
          Printf("Line %d has no first side.\n",uVar13);
          puVar14[6] = 0;
        }
        iVar9 = sidecount + 1;
        if (puVar14[7] != 0xffff) {
          iVar9 = sidecount + 2;
        }
        sidecount = iVar9;
        linemap.Array[lVar15] = uVar10 + iVar12;
        uVar13 = (ulong)(uVar10 + 1);
      }
    } while ((int)uVar13 < numlines);
    if (0 < iVar12) {
      ForceNodeBuild = true;
    }
  }
  P_AllocateSideDefs(sidecount);
  if (0 < numlines) {
    iVar12 = 0;
    puVar14 = puVar11;
    ld = lines;
    do {
      ld->portalindex = 0xffffffff;
      lVar15 = 0xb;
      do {
        ld->args[lVar15 + -0xb] = (uint)*(byte *)((long)puVar14 + lVar15 + -4);
        lVar15 = lVar15 + 1;
      } while (lVar15 != 0x10);
      ld->flags = (uint)puVar14[2];
      ld->special = (uint)(byte)puVar14[3];
      ld->v1 = vertexes + *puVar14;
      ld->v2 = vertexes + puVar14[1];
      ld->alpha = 1.0;
      P_SetSideNum(ld->sidedef,puVar14[6]);
      P_SetSideNum(ld->sidedef + 1,puVar14[7]);
      P_AdjustLine(ld);
      P_SetLineID(iVar12,ld);
      P_SaveLineSpecial(ld);
      DVar8 = level.flags2;
      if ((level.flags2 >> 9 & 1) != 0) {
        pbVar2 = (byte *)((long)&ld->flags + 2);
        *pbVar2 = *pbVar2 | 8;
      }
      if ((DVar8 >> 10 & 1) != 0) {
        pbVar2 = (byte *)((long)&ld->flags + 2);
        *pbVar2 = *pbVar2 | 0x10;
      }
      if ((DVar8 >> 0xb & 1) != 0) {
        pbVar2 = (byte *)((long)&ld->flags + 2);
        *pbVar2 = *pbVar2 | 0x40;
      }
      uVar10 = ld->flags >> 10 & 7;
      ld->activation = 1 << (sbyte)uVar10;
      if ((uVar10 | 4) == 7) {
        ld->activation = 0x28;
      }
      ld->flags = ld->flags & 0xffffe3ff;
      iVar12 = iVar12 + 1;
      puVar14 = puVar14 + 8;
      ld = ld + 1;
    } while (iVar12 < numlines);
  }
  operator_delete__(puVar11);
  return;
}

Assistant:

void P_LoadLineDefs2 (MapData * map)
{
	int i, skipped;
	line_t *ld;
	int lumplen = map->Size(ML_LINEDEFS);
	char * mldf;
	maplinedef2_t *mld;
		
	numlines = lumplen / sizeof(maplinedef2_t);
	lines = new line_t[numlines];
	linemap.Resize(numlines);
	memset (lines, 0, numlines*sizeof(line_t));

	mldf = new char[lumplen];
	map->Read(ML_LINEDEFS, mldf);

	// [RH] Remove any lines that have 0 length and count sidedefs used
	for (skipped = sidecount = i = 0; i < numlines; )
	{
		mld = ((maplinedef2_t*)mldf) + i;

		if (mld->v1 == mld->v2 ||
			(vertexes[LittleShort(mld->v1)].fX() == vertexes[LittleShort(mld->v2)].fX() &&
			 vertexes[LittleShort(mld->v1)].fY() == vertexes[LittleShort(mld->v2)].fY()))
		{
			Printf ("Removing 0-length line %d\n", i+skipped);
			memmove (mld, mld+1, sizeof(*mld)*(numlines-i-1));
			skipped++;
			numlines--;
		}
		else
		{
			// patch missing first sides instead of crashing out.
			// Visual glitches are better than not being able to play.
			if (LittleShort(mld->sidenum[0]) == NO_INDEX)
			{
				Printf("Line %d has no first side.\n", i);
				mld->sidenum[0] = 0;
			}
			sidecount++;
			if (LittleShort(mld->sidenum[1]) != NO_INDEX)
				sidecount++;
			linemap[i] = i+skipped;
			i++;
		}
	}
	if (skipped > 0)
	{
		ForceNodeBuild = true;
	}

	P_AllocateSideDefs (sidecount);

	mld = (maplinedef2_t *)mldf;
	ld = lines;
	for (i = 0; i < numlines; i++, mld++, ld++)
	{
		int j;

		ld->portalindex = UINT_MAX;

		for (j = 0; j < 5; j++)
			ld->args[j] = mld->args[j];

		ld->flags = LittleShort(mld->flags);
		ld->special = mld->special;

		ld->v1 = &vertexes[LittleShort(mld->v1)];
		ld->v2 = &vertexes[LittleShort(mld->v2)];
		ld->alpha = 1.;	// [RH] Opaque by default

		P_SetSideNum (&ld->sidedef[0], LittleShort(mld->sidenum[0]));
		P_SetSideNum (&ld->sidedef[1], LittleShort(mld->sidenum[1]));

		P_AdjustLine (ld);
		P_SetLineID(i, ld);
		P_SaveLineSpecial (ld);
		if (level.flags2 & LEVEL2_CLIPMIDTEX) ld->flags |= ML_CLIP_MIDTEX;
		if (level.flags2 & LEVEL2_WRAPMIDTEX) ld->flags |= ML_WRAP_MIDTEX;
		if (level.flags2 & LEVEL2_CHECKSWITCHRANGE) ld->flags |= ML_CHECKSWITCHRANGE;

		// convert the activation type
		ld->activation = 1 << GET_SPAC(ld->flags);
		if (ld->activation == SPAC_AnyCross)
		{ // this is really PTouch
			ld->activation = SPAC_Impact | SPAC_PCross;
		}
		else if (ld->activation == SPAC_Impact)
		{ // In non-UMDF maps, Impact implies PCross
			ld->activation = SPAC_Impact | SPAC_PCross;
		}
		ld->flags &= ~ML_SPAC_MASK;
	}
	delete[] mldf;
}